

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool re2::Regexp::SimplifyRegexp(StringPiece *src,ParseFlags flags,string *dst,RegexpStatus *status)

{
  Regexp *pRVar1;
  LogMessage *this;
  RegexpStatus *in_RCX;
  string *in_RDX;
  StringPiece *in_RDI;
  Regexp *sre;
  Regexp *re;
  ParseFlags in_stack_00000204;
  StringPiece *in_stack_00000208;
  LogMessage *this_00;
  string local_1e8 [28];
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  LogMessage *in_stack_fffffffffffffe40;
  Regexp *in_stack_fffffffffffffe48;
  Regexp *in_stack_fffffffffffffe50;
  Regexp *in_stack_fffffffffffffe68;
  bool local_1;
  
  pRVar1 = Parse(in_stack_00000208,in_stack_00000204,(RegexpStatus *)src);
  if (pRVar1 == (Regexp *)0x0) {
    local_1 = false;
  }
  else {
    pRVar1 = Simplify(in_stack_fffffffffffffe68);
    Decref(in_stack_fffffffffffffe50);
    if (pRVar1 == (Regexp *)0x0) {
      this_00 = (LogMessage *)&stack0xfffffffffffffe48;
      LogMessage::LogMessage
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
      this = (LogMessage *)LogMessage::stream(this_00);
      std::operator<<((ostream *)this,"Simplify failed on ");
      re2::operator<<((ostream *)this,(StringPiece *)this_00);
      LogMessage::~LogMessage(this);
      if (in_RCX != (RegexpStatus *)0x0) {
        RegexpStatus::set_code(in_RCX,kRegexpInternalError);
        RegexpStatus::set_error_arg(in_RCX,in_RDI);
      }
      local_1 = false;
    }
    else {
      ToString_abi_cxx11_(in_stack_fffffffffffffe48);
      std::__cxx11::string::operator=(in_RDX,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      Decref(in_stack_fffffffffffffe50);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Regexp::SimplifyRegexp(const StringPiece& src, ParseFlags flags,
                            std::string* dst, RegexpStatus* status) {
  Regexp* re = Parse(src, flags, status);
  if (re == NULL)
    return false;
  Regexp* sre = re->Simplify();
  re->Decref();
  if (sre == NULL) {
    // Should not happen, since Simplify never fails.
    LOG(ERROR) << "Simplify failed on " << src;
    if (status) {
      status->set_code(kRegexpInternalError);
      status->set_error_arg(src);
    }
    return false;
  }
  *dst = sre->ToString();
  sre->Decref();
  return true;
}